

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_AddNumberToObject(cJSON *object,char *name,double number)

{
  cJSON_bool cVar1;
  cJSON *number_item;
  double number_local;
  char *name_local;
  cJSON *object_local;
  
  object_local = cJSON_CreateNumber(number);
  cVar1 = add_item_to_object(object,name,object_local,&global_hooks,0);
  if (cVar1 == 0) {
    cJSON_Delete(object_local);
    object_local = (cJSON *)0x0;
  }
  return object_local;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddNumberToObject(cJSON * const object, const char * const name, const double number)
{
    cJSON *number_item = cJSON_CreateNumber(number);
    if (add_item_to_object(object, name, number_item, &global_hooks, false))
    {
        return number_item;
    }

    cJSON_Delete(number_item);
    return NULL;
}